

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_call_to_arms(CHAR_DATA *ch,char *arguement)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  CHAR_DATA *ch_00;
  
  bVar2 = is_npc(ch);
  if (bVar2) {
    return;
  }
  if (ch->mana < 10) {
    pcVar5 = "You are unable to muster the force of will to lead more crusades.\n\r";
LAB_002f51bf:
    send_to_char(pcVar5,ch);
    return;
  }
  if (ch->fighting == (CHAR_DATA *)0x0) {
    send_to_char("You give a stirring call to arms, but alas there is nobody to fight.\n\r",ch);
    pcVar5 = "$n cries out to nobody in particular to fight nobody in particular.";
  }
  else {
    if ((ch->act[0] & 0x8000000) != 0) {
      pcVar5 = "Do you really think people will rally to a criminal?!\n\r";
      goto LAB_002f51bf;
    }
    bVar2 = is_good(ch);
    if (bVar2) {
      iVar3 = number_percent();
      iVar4 = get_skill(ch,(int)gsn_rally);
      if (iVar4 < iVar3) {
        send_to_char("You yell some wild rhetoric but fail to inspire anyone.\n\r",ch);
        check_improve(ch,(int)gsn_rally,false,2);
      }
      else {
        act("$n gives a stirring call to arms!",ch,(void *)0x0,(void *)0x0,0);
        send_to_char("You give a stirring call to arms!\n\r",ch);
        pCVar1 = ch->in_room->people;
        while (ch_00 = pCVar1, ch_00 != (CHAR_DATA *)0x0) {
          pCVar1 = ch_00->next_in_room;
          bVar2 = is_good(ch_00);
          if (bVar2) {
            bVar2 = is_npc(ch_00);
            if (bVar2) {
              bVar2 = is_affected_by(ch_00,0x12);
              if (!bVar2) {
                bVar2 = is_same_group(ch,ch_00);
                if ((((!bVar2) && (ch_00->position != 7 && 4 < ch_00->position)) && (0xe < ch->mana)
                    ) && (ch->fighting != (CHAR_DATA *)0x0)) {
                  if (ch->level + 0xc < (int)ch_00->level) {
                    act("$n tells you, \'Fight your own battles and prove your worth paladin\'",
                        ch_00,(void *)0x0,ch,2);
                  }
                  else {
                    iVar3 = number_percent();
                    if (((int)ch->level - (int)ch_00->level) + 0x46 < iVar3) {
                      act("Your call to arms gets little more than a passing consideration from $N."
                          ,ch,(void *)0x0,ch_00,3);
                      check_improve(ch,(int)gsn_rally,false,2);
                    }
                    else {
                      ch->mana = ch->mana + -0xf;
                      act("$N rallies to your call!",ch,(void *)0x0,ch_00,3);
                      act("$n screams and rushes to attack $N!",ch_00,(void *)0x0,ch->fighting,1);
                      act("$n screams and rushes forwards to attack you!",ch_00,(void *)0x0,
                          ch->fighting,2);
                      multi_hit(ch_00,ch->fighting,-1);
                    }
                  }
                }
              }
            }
          }
        }
      }
      WAIT_STATE(ch,0xc);
      return;
    }
    send_to_char("Despite your best attempts nobody will join you.\n\r",ch);
    pcVar5 = "$n gives a pathetic call to arms.";
  }
  act(pcVar5,ch,(void *)0x0,(void *)0x0,0);
  return;
}

Assistant:

void do_call_to_arms(CHAR_DATA *ch, char *arguement)
{
	CHAR_DATA *target;
	CHAR_DATA *target_next;

	if (is_npc(ch))
		return;

	if (ch->mana < 10)
	{
		send_to_char("You are unable to muster the force of will to lead more crusades.\n\r", ch);
		return;
	}

	if (ch->fighting == nullptr)
	{
		send_to_char("You give a stirring call to arms, but alas there is nobody to fight.\n\r", ch);
		act("$n cries out to nobody in particular to fight nobody in particular.", ch, nullptr, nullptr, TO_ROOM);
		return;
	}

	if (IS_SET(ch->act, PLR_CRIMINAL))
	{
		send_to_char("Do you really think people will rally to a criminal?!\n\r", ch);
		return;
	}

	if (!is_good(ch))
	{
		send_to_char("Despite your best attempts nobody will join you.\n\r", ch);
		act("$n gives a pathetic call to arms.", ch, nullptr, nullptr, TO_ROOM);
		return;
	}

	if (number_percent() > get_skill(ch, gsn_rally))
	{
		send_to_char("You yell some wild rhetoric but fail to inspire anyone.\n\r", ch);
		check_improve(ch, gsn_rally, false, 2);
		WAIT_STATE(ch, 12);
		return;
	}

	act("$n gives a stirring call to arms!", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You give a stirring call to arms!\n\r", ch);

	for (target = ch->in_room->people; target != nullptr; target = target_next)
	{
		target_next = target->next_in_room;

		if (!is_good(target) || !is_npc(target) || is_affected_by(target, AFF_CHARM))
			continue;

		if (is_same_group(ch, target) || target->position < POS_RESTING)
			continue;

		if (target->position == POS_FIGHTING)
			continue;

		if (ch->mana < 15)
			continue;

		if (ch->fighting == nullptr)
			continue;

		if (target->level > (ch->level + 12))
		{
			act("$n tells you, 'Fight your own battles and prove your worth paladin'", target, nullptr, ch, TO_VICT);
			continue;
		}

		if (number_percent() > (ch->level - target->level + 70))
		{
			act("Your call to arms gets little more than a passing consideration from $N.", ch, nullptr, target, TO_CHAR);
			check_improve(ch, gsn_rally, false, 2);
			continue;
		}

		ch->mana -= 15;

		act("$N rallies to your call!", ch, nullptr, target, TO_CHAR);
		act("$n screams and rushes to attack $N!", target, nullptr, ch->fighting, TO_NOTVICT);
		act("$n screams and rushes forwards to attack you!", target, nullptr, ch->fighting, TO_VICT);
		multi_hit(target, ch->fighting, TYPE_UNDEFINED);
		continue;
	}

	WAIT_STATE(ch, 12);
}